

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-hand.cpp
# Opt level: O3

int __thiscall mahjong::PlayerHand::remove(PlayerHand *this,char *__filename)

{
  size_type sVar1;
  _Base_ptr p_Var2;
  iterator iVar3;
  _Base_ptr p_Var4;
  const_iterator __position;
  Tile local_14;
  
  local_14 = (Tile)__filename;
  sVar1 = std::
          _Rb_tree<mahjong::Tile,_mahjong::Tile,_std::_Identity<mahjong::Tile>,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
          ::count(&(this->tiles)._M_t,&local_14);
  if (sVar1 == 0) {
    __assert_fail("0 < tiles.count(tile)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/src/player-hand.cpp"
                  ,0x13,"void mahjong::PlayerHand::remove(Tile)");
  }
  if ((this->ready_type != not_ready) && (this->last_tile != local_14)) {
    __assert_fail("ready_type == ReadyType::not_ready || last_tile == tile",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/src/player-hand.cpp"
                  ,0x14,"void mahjong::PlayerHand::remove(Tile)");
  }
  p_Var2 = (this->tiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __position._M_node = &(this->tiles)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var4 = __position._M_node;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if ((int)local_14 <= (int)p_Var2[1]._M_color) {
        p_Var4 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < (int)local_14];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((p_Var4 != __position._M_node) && ((int)p_Var4[1]._M_color <= (int)local_14)) {
      __position._M_node = p_Var4;
    }
  }
  iVar3 = std::
          _Rb_tree<mahjong::Tile,mahjong::Tile,std::_Identity<mahjong::Tile>,std::less<mahjong::Tile>,std::allocator<mahjong::Tile>>
          ::erase_abi_cxx11_((_Rb_tree<mahjong::Tile,mahjong::Tile,std::_Identity<mahjong::Tile>,std::less<mahjong::Tile>,std::allocator<mahjong::Tile>>
                              *)&this->tiles,__position);
  return (int)iVar3._M_node;
}

Assistant:

void PlayerHand::remove(Tile tile)
{
	assert(0 < tiles.count(tile));
	assert(ready_type == ReadyType::not_ready || last_tile == tile);

	auto it = tiles.find(tile);
	tiles.erase(it);
}